

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O3

void __thiscall gl4cts::GetTextureSubImage::Functional::clean(Functional *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_texture != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_texture);
    this->m_texture = 0;
  }
  return;
}

Assistant:

void gl4cts::GetTextureSubImage::Functional::clean()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_texture)
	{
		gl.deleteTextures(1, &m_texture);

		m_texture = 0;
	}
}